

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joystickmenu.cpp
# Opt level: O0

int __thiscall FOptionMenuItemJoyMap::GetSelection(FOptionMenuItemJoyMap *this)

{
  FOptionValues **ppFVar1;
  int iVar2;
  uint uVar3;
  Pair *pPVar4;
  uint local_30;
  FName local_2c;
  uint i;
  FOptionValues **opt;
  double f;
  FOptionMenuItemJoyMap *this_local;
  
  f = (double)this;
  iVar2 = (*SELECTED_JOYSTICK->_vptr_IJoystickConfig[7])
                    (SELECTED_JOYSTICK,
                     (ulong)*(uint *)&(this->super_FOptionMenuItemOptionBase).field_0x34);
  opt = (FOptionValues **)(double)iVar2;
  FName::FName(&local_2c,
               (FName *)&(this->super_FOptionMenuItemOptionBase).super_FOptionMenuItem.field_0x24);
  _i = TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>::CheckKey
                 (&OptionValues,&local_2c);
  if ((_i != (FOptionValues **)0x0) && (*_i != (FOptionValues *)0x0)) {
    for (local_30 = 0;
        uVar3 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::Size(&(*_i)->mValues),
        ppFVar1 = opt, local_30 < uVar3; local_30 = local_30 + 1) {
      pPVar4 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::operator[]
                         (&(*_i)->mValues,(ulong)local_30);
      if (ABS((double)ppFVar1 - pPVar4->Value) < 1.1920928955078125e-07) {
        return local_30;
      }
    }
  }
  return -1;
}

Assistant:

int GetSelection()
	{
		double f = SELECTED_JOYSTICK->GetAxisMap(mAxis);
		FOptionValues **opt = OptionValues.CheckKey(mValues);
		if (opt != NULL && *opt != NULL)
		{
			// Map from joystick axis to menu selection.
			for(unsigned i = 0; i < (*opt)->mValues.Size(); i++)
			{
				if (fabs(f - (*opt)->mValues[i].Value) < FLT_EPSILON)
				{
					return i;
				}
			}
		}
		return -1;
	}